

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

bool libcellml::equalEntities
               (EntityPtr *owner,
               vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
               *entities)

{
  Entity *this;
  undefined8 this_00;
  element_type *this_01;
  bool bVar1;
  long lVar2;
  _func_int *p_Var3;
  element_type *peVar4;
  ulong __n;
  VariablePtr variableOther;
  shared_ptr<libcellml::Variable> variable;
  UnitsPtr unitsOther;
  ResetPtr resetOther;
  vector<unsigned_long,_std::allocator<unsigned_long>_> unmatchedIndex;
  shared_ptr<libcellml::Model> model;
  undefined1 local_b8 [16];
  shared_ptr<libcellml::Entity> local_a8;
  undefined1 local_98 [24];
  undefined1 local_80 [24];
  ImportedEntityImpl *local_68;
  shared_ptr<libcellml::Entity> local_58;
  EntityPtr *local_48;
  __shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_80 + 0x10),
             (long)(entities->
                   super__Vector_base<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(entities->
                   super__Vector_base<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&local_58);
  p_Var3 = (_func_int *)0x0;
  for (lVar2 = 0; (ImportedEntityImpl *)(local_80._16_8_ + lVar2) != local_68; lVar2 = lVar2 + 8) {
    *(_func_int **)(local_80._16_8_ + p_Var3 * 8) = p_Var3;
    p_Var3 = p_Var3 + 1;
  }
  local_98._16_8_ =
       (entities->
       super__Vector_base<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_48 = owner;
  for (peVar4 = (element_type *)
                (entities->
                super__Vector_base<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      peVar4 != (element_type *)local_98._16_8_;
      peVar4 = (element_type *)&peVar4->super_enable_shared_from_this<libcellml::Model>) {
    lVar2 = 0;
    bVar1 = false;
    __n = 0;
    while( true ) {
      if (((ulong)((long)local_68 - local_80._16_8_ >> 3) <= __n) || (bVar1 != false)) break;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_80 + 0x10),__n);
      std::dynamic_pointer_cast<libcellml::Model,libcellml::Entity>(&local_58);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_58.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::dynamic_pointer_cast<libcellml::Component,libcellml::Entity>
                  ((shared_ptr<libcellml::Entity> *)local_98);
        std::dynamic_pointer_cast<libcellml::Variable,libcellml::Entity>(&local_a8);
        if (local_a8.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (Entity *)0x0) {
          std::dynamic_pointer_cast<libcellml::Reset,libcellml::Entity>
                    ((shared_ptr<libcellml::Entity> *)local_b8);
          Component::reset((Component *)local_80,local_98._0_8_);
          this_00 = local_b8._0_8_;
          std::__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<libcellml::Reset,void>
                    (local_40,(__shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2> *)local_80
                    );
          bVar1 = Entity::equals((Entity *)this_00,(EntityPtr *)local_40);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
        }
        else {
          Component::variable((Component *)local_b8,local_98._0_8_);
          this_01 = local_a8.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          std::__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<libcellml::Variable,void>
                    ((__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2> *)local_80,
                     (__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *)local_b8);
          bVar1 = Entity::equals(this_01,(EntityPtr *)local_80);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_a8.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
      }
      else {
        Model::units((Model *)local_98,
                     (size_t)local_58.
                             super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
        this = ((__shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2> *)
               &peVar4->super_ComponentEntity)->_M_ptr;
        std::__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<libcellml::Units,void>
                  ((__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2> *)&local_a8,
                   (__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)local_98);
        bVar1 = Entity::equals(this,(EntityPtr *)&local_a8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_a8.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_58.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      __n = __n + 1;
      lVar2 = lVar2 + 8;
    }
    if (bVar1 == false) break;
    if ((ImportedEntityImpl *)(local_80._16_8_ + lVar2) != local_68) {
      memmove((void *)(local_80._16_8_ + lVar2 + -8),(ImportedEntityImpl *)(local_80._16_8_ + lVar2)
              ,((long)local_68 - local_80._16_8_) - lVar2);
    }
    local_68 = (ImportedEntityImpl *)((long)&local_68[-1].mImportReference.field_2 + 8);
  }
  bVar1 = peVar4 == (element_type *)local_98._16_8_;
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)(local_80 + 0x10));
  return bVar1;
}

Assistant:

bool equalEntities(const EntityPtr &owner, const std::vector<EntityPtr> &entities)
{
    std::vector<size_t> unmatchedIndex(entities.size());
    std::iota(unmatchedIndex.begin(), unmatchedIndex.end(), 0);
    for (const auto &entity : entities) {
        bool entityFound = false;
        size_t index = 0;
        for (index = 0; index < unmatchedIndex.size() && !entityFound; ++index) {
            size_t currentIndex = unmatchedIndex.at(index);
            auto model = std::dynamic_pointer_cast<Model>(owner);
            if (model != nullptr) {
                auto unitsOther = model->units(currentIndex);
                if (entity->equals(unitsOther)) {
                    entityFound = true;
                }
            } else {
                auto component = std::dynamic_pointer_cast<Component>(owner);
                auto variable = std::dynamic_pointer_cast<Variable>(entity);
                if (variable != nullptr) {
                    auto variableOther = component->variable(currentIndex);
                    if (variable->equals(variableOther)) {
                        entityFound = true;
                    }
                } else {
                    auto reset = std::dynamic_pointer_cast<Reset>(entity);
                    auto resetOther = component->reset(currentIndex);
                    if (reset->equals(resetOther)) {
                        entityFound = true;
                    }
                }
            }
        }
        if (entityFound) {
            // We are going to assume here that nobody is going to add more
            // than 2,147,483,647 units to this component. And much more than
            // that in a 64-bit environment.
            unmatchedIndex.erase(unmatchedIndex.begin() + ptrdiff_t(index) - 1);
        } else {
            return false;
        }
    }
    return true;
}